

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

vector_type * __thiscall
Disa::Vector_Dense<double,0ul>::operator+=
          (Vector_Dense<double,0ul> *this,Vector_Dense<double,_2UL> *vector)

{
  long lVar1;
  ostream *poVar2;
  source_location *location;
  size_type index;
  long lVar3;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = *(long *)this;
  location = (source_location *)(*(long *)(this + 8) - lVar1);
  if (location == (source_location *)0x10) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      *(double *)(lVar1 + lVar3 * 8) =
           (vector->super_array<double,_2UL>)._M_elems[lVar3] + *(double *)(lVar1 + lVar3 * 8);
    }
    return (vector_type *)this;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_40 = &PTR_s__workspace_llm4binary_github_lic_001722c8;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::__cxx11::to_string(&local_e0,*(long *)(this + 8) - *(long *)this >> 3);
  std::operator+(&local_c0,"Incompatible vector sizes, ",&local_e0);
  std::operator+(&local_a0,&local_c0," vs. ");
  std::__cxx11::to_string(&local_100,2);
  std::operator+(&local_80,&local_a0,&local_100);
  std::operator+(&local_60,&local_80,".");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

constexpr vector_type& operator+=(const Vector_Dense<_type, _size_other>& vector) {
    ASSERT_DEBUG(this->size() == vector.size(), "Incompatible vector sizes, " + std::to_string(this->size()) + " vs. " +
                                                std::to_string(vector.size()) + ".");
    FOR(index, this->size())(*this)[index] += vector[index];
    return *this;
  }